

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O1

void __thiscall leveldb::VersionEdit::Clear(VersionEdit *this)

{
  _Rb_tree_header *p_Var1;
  pair<int,_leveldb::FileMetaData> *__first;
  pair<int,_leveldb::FileMetaData> *__last;
  
  (this->comparator_)._M_string_length = 0;
  *(this->comparator_)._M_dataplus._M_p = '\0';
  *(undefined8 *)((long)&this->last_sequence_ + 5) = 0;
  this->next_file_number_ = 0;
  this->last_sequence_ = 0;
  this->log_number_ = 0;
  this->prev_log_number_ = 0;
  std::
  _Rb_tree<std::pair<int,_unsigned_long>,_std::pair<int,_unsigned_long>,_std::_Identity<std::pair<int,_unsigned_long>_>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
  ::_M_erase(&(this->deleted_files_)._M_t,
             (_Link_type)
             (this->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  p_Var1 = &(this->deleted_files_)._M_t._M_impl.super__Rb_tree_header;
  (this->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __first = (this->new_files_).
            super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __last = (this->new_files_).
           super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__last != __first) {
    std::_Destroy_aux<false>::__destroy<std::pair<int,leveldb::FileMetaData>*>(__first,__last);
    (this->new_files_).
    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = __first;
  }
  return;
}

Assistant:

void VersionEdit::Clear() {
  comparator_.clear();
  log_number_ = 0;
  prev_log_number_ = 0;
  last_sequence_ = 0;
  next_file_number_ = 0;
  has_comparator_ = false;
  has_log_number_ = false;
  has_prev_log_number_ = false;
  has_next_file_number_ = false;
  has_last_sequence_ = false;
  deleted_files_.clear();
  new_files_.clear();
}